

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock::CovarianceMatrix::
     verifySize(int NPL,int NPARB)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to NPARB * ( NPARB + 1 ) / 2";
  }
  else {
    if (NPARB < 1) {
      tools::Log::error<char_const*>("Encountered illegal NPARB value");
      tools::Log::info<char_const*>("NPARB should be larger than zero");
      goto LAB_00134c31;
    }
    if ((uint)((NPARB + 1) * NPARB) >> 1 == NPL) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to NPARB * ( NPARB + 1 ) / 2";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_00134c31:
  tools::Log::info<char_const*,int>("NPARB value: {}",NPARB);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NPARB ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to NPARB * ( NPARB + 1 ) / 2" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPARB value: {}", NPARB );
    throw std::exception();
  }

  if ( NPARB < 1 ) {

    Log::error( "Encountered illegal NPARB value" );
    Log::info( "NPARB should be larger than zero" );
    Log::info( "NPARB value: {}", NPARB );
    throw std::exception();
  }

  if ( NPL != NPARB * ( NPARB + 1 ) / 2 ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to NPARB * ( NPARB + 1 ) / 2" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPARB value: {}", NPARB );
    throw std::exception();
  }
}